

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

UniValue *
AddrmanTableToJSON(UniValue *__return_storage_ptr__,
                  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                  *tableInfos,CConnman *connman)

{
  int iVar1;
  int iVar2;
  string str;
  string key_00;
  ostream *poVar3;
  pointer ppVar4;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd30;
  pointer ppVar5;
  UniValue in_stack_fffffffffffffd38;
  string local_270 [32];
  ostringstream key;
  AddrInfo info;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = (size_type)__return_storage_ptr__;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
  str.field_2._M_allocated_capacity = (size_type)connman;
  str.field_2._8_8_ = in_stack_fffffffffffffd30;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_58);
  ppVar5 = (tableInfos->
           super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (tableInfos->
                super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar5; ppVar4 = ppVar4 + 1) {
    AddrInfo::AddrInfo(&info,&ppVar4->first);
    iVar1 = (ppVar4->second).bucket;
    iVar2 = (ppVar4->second).position;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&key);
    poVar3 = (ostream *)std::ostream::operator<<((ostringstream *)&key,iVar1);
    poVar3 = std::operator<<(poVar3,"/");
    std::ostream::operator<<(poVar3,iVar2);
    std::__cxx11::stringbuf::str();
    AddrmanEntryToJSON((UniValue *)&stack0xfffffffffffffd38,&info,connman);
    key_00._M_string_length = (size_type)__return_storage_ptr__;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
    key_00.field_2._M_allocated_capacity = (size_type)connman;
    key_00.field_2._8_8_ = ppVar5;
    UniValue::pushKVEnd(__return_storage_ptr__,key_00,in_stack_fffffffffffffd38);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffd38);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&key);
    AddrInfo::~AddrInfo(&info);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue AddrmanTableToJSON(const std::vector<std::pair<AddrInfo, AddressPosition>>& tableInfos, CConnman& connman)
{
    UniValue table(UniValue::VOBJ);
    for (const auto& e : tableInfos) {
        AddrInfo info = e.first;
        AddressPosition location = e.second;
        std::ostringstream key;
        key << location.bucket << "/" << location.position;
        // Address manager tables have unique entries so there is no advantage
        // in using UniValue::pushKV, which checks if the key already exists
        // in O(N). UniValue::pushKVEnd is used instead which currently is O(1).
        table.pushKVEnd(key.str(), AddrmanEntryToJSON(info, connman));
    }
    return table;
}